

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CCov.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_dab6::CCov::addCoverageTraceCall
          (CCov *this,Instruction *Inst,FunctionCallee CoverageFunction)

{
  uint uVar1;
  StringRef Str;
  char *pcVar2;
  size_t sVar3;
  uint uVar4;
  long lVar5;
  Constant *pCVar6;
  IntegerType *pIVar7;
  ArrayRef<llvm::Value_*> Args_00;
  StringRef Str_00;
  undefined1 auVar8 [16];
  string FileNameStr;
  array<llvm::Value_*,_4UL> Args;
  IRBuilder<llvm::ConstantFolder,_llvm::IRBuilderDefaultInserter> Builder;
  char *local_130;
  size_t local_128;
  char local_120;
  undefined7 uStack_11f;
  FunctionType *local_110;
  Value *local_108;
  Constant *local_100;
  Constant *local_f8;
  undefined8 local_f0;
  undefined8 local_e8;
  Twine local_e0;
  IRBuilder<llvm::ConstantFolder,_llvm::IRBuilderDefaultInserter> local_b8;
  
  local_108 = CoverageFunction.Callee;
  local_110 = CoverageFunction.FnTy;
  uVar4 = 0;
  llvm::IRBuilder<llvm::ConstantFolder,_llvm::IRBuilderDefaultInserter>::IRBuilder
            (&local_b8,Inst,(MDNode *)0x0,
             (ArrayRef<llvm::OperandBundleDefT<llvm::Value_*>_>)ZEXT816(0));
  if (this->FileName == (Constant *)0x0) {
    lVar5 = llvm::Instruction::getModule();
    local_130 = &local_120;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_130,*(long *)(lVar5 + 0xd0),
               *(long *)(lVar5 + 0xd8) + *(long *)(lVar5 + 0xd0));
    Str.Length = local_128;
    Str.Data = local_130;
    llvm::Twine::Twine(&local_e0,"");
    pCVar6 = llvm::IRBuilderBase::CreateGlobalStringPtr
                       (&local_b8.super_IRBuilderBase,Str,&local_e0,0,(Module *)0x0);
    this->FileName = pCVar6;
    if (local_130 != &local_120) {
      operator_delete(local_130,CONCAT71(uStack_11f,local_120) + 1);
    }
  }
  local_f8 = this->FunctionName;
  if (local_f8 == (Constant *)0x0) {
    llvm::Instruction::getFunction();
    auVar8 = llvm::Value::getName();
    lVar5 = auVar8._0_8_;
    if (lVar5 == 0) {
      local_130 = &local_120;
      local_128 = 0;
      local_120 = '\0';
    }
    else {
      local_130 = &local_120;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_130,lVar5,auVar8._8_8_ + lVar5);
    }
    sVar3 = local_128;
    pcVar2 = local_130;
    llvm::Twine::Twine(&local_e0,"");
    Str_00.Length = sVar3;
    Str_00.Data = pcVar2;
    local_f8 = llvm::IRBuilderBase::CreateGlobalStringPtr
                         (&local_b8.super_IRBuilderBase,Str_00,&local_e0,0,(Module *)0x0);
    this->FunctionName = local_f8;
    if (local_130 != &local_120) {
      operator_delete(local_130,CONCAT71(uStack_11f,local_120) + 1);
      local_f8 = this->FunctionName;
    }
    uVar4 = 1;
  }
  uVar1 = uVar4 + 2;
  if (Inst[0x10] != (Instruction)0x1c) {
    uVar1 = uVar4;
  }
  local_100 = this->FileName;
  uVar4 = llvm::DebugLoc::getLine();
  pIVar7 = (IntegerType *)llvm::Type::getInt32Ty(local_b8.super_IRBuilderBase.Context);
  local_f0 = llvm::ConstantInt::get(pIVar7,(ulong)uVar4,false);
  pIVar7 = (IntegerType *)llvm::Type::getInt32Ty(local_b8.super_IRBuilderBase.Context);
  local_e8 = llvm::ConstantInt::get(pIVar7,(ulong)uVar1,false);
  llvm::Twine::Twine(&local_e0,"");
  Args_00.Length = 4;
  Args_00.Data = (Value **)&local_100;
  llvm::IRBuilderBase::CreateCall
            (&local_b8.super_IRBuilderBase,local_110,local_108,Args_00,&local_e0,(MDNode *)0x0);
  llvm::IRBuilderDefaultInserter::~IRBuilderDefaultInserter(&local_b8.Inserter);
  llvm::IRBuilderFolder::~IRBuilderFolder((IRBuilderFolder *)&local_b8.Folder);
  if ((SmallVectorStorage<std::pair<unsigned_int,_llvm::MDNode_*>,_2U> *)
      local_b8.super_IRBuilderBase.MetadataToCopy.
      super_SmallVectorImpl<std::pair<unsigned_int,_llvm::MDNode_*>_>.
      super_SmallVectorTemplateBase<std::pair<unsigned_int,_llvm::MDNode_*>,_true>.
      super_SmallVectorTemplateCommon<std::pair<unsigned_int,_llvm::MDNode_*>,_void>.
      super_SmallVectorBase<unsigned_int>.BeginX !=
      &local_b8.super_IRBuilderBase.MetadataToCopy.
       super_SmallVectorStorage<std::pair<unsigned_int,_llvm::MDNode_*>,_2U>) {
    free(local_b8.super_IRBuilderBase.MetadataToCopy.
         super_SmallVectorImpl<std::pair<unsigned_int,_llvm::MDNode_*>_>.
         super_SmallVectorTemplateBase<std::pair<unsigned_int,_llvm::MDNode_*>,_true>.
         super_SmallVectorTemplateCommon<std::pair<unsigned_int,_llvm::MDNode_*>,_void>.
         super_SmallVectorBase<unsigned_int>.BeginX);
  }
  return;
}

Assistant:

void CCov::addCoverageTraceCall(Instruction *Inst,
    FunctionCallee CoverageFunction) {
  IRBuilder<> Builder(Inst);
  const DebugLoc &Loc = Inst->getDebugLoc();
  std::array<Value *, 4> Args;
  uint32_t Attribute = 0;
  if (!FileName) {
    std::string FileNameStr = Inst->getModule()->getSourceFileName();
    FileName = Builder.CreateGlobalStringPtr(FileNameStr);
  }
  if (!FunctionName) {
    std::string FunctionNameStr = Inst->getFunction()->getName().str();
    FunctionName = Builder.CreateGlobalStringPtr(FunctionNameStr);
    Attribute |= CCov_Entry;
  }
  if (Inst->getOpcode() == Instruction::Ret)
    Attribute |= CCov_Ret;
  Args[0] = FileName;
  Args[1] = FunctionName;
  Args[2] = Builder.getInt32((uint32_t)Loc.getLine());
  Args[3] = Builder.getInt32(Attribute);
  Builder.CreateCall(CoverageFunction, ArrayRef<Value *>(Args));
}